

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

string * __thiscall
chaiscript::exception::eval_error::pretty_print_abi_cxx11_
          (string *__return_storage_ptr__,eval_error *this)

{
  ulong uVar1;
  bool bVar2;
  AST_Node_Type AVar3;
  char *pcVar4;
  ostream *poVar5;
  const_reference pvVar6;
  string *psVar7;
  size_type sVar8;
  string local_248;
  string local_228;
  ulong local_208;
  size_t j;
  string local_1e0;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream ss;
  eval_error *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  pcVar4 = (char *)(**(code **)(*(long *)this + 0x10))();
  std::operator<<((ostream *)local_190,pcVar4);
  bVar2 = std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>::
          empty(&this->call_stack);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)local_190,"during evaluation at (");
    pvVar6 = std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>::
             operator[](&this->call_stack,0);
    psVar7 = fname<chaiscript::AST_Node_Trace>(pvVar6);
    poVar5 = std::operator<<(poVar5,(string *)psVar7);
    poVar5 = std::operator<<(poVar5," ");
    pvVar6 = std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>::
             operator[](&this->call_stack,0);
    startpos<chaiscript::AST_Node_Trace>(&local_1c0,pvVar6);
    poVar5 = std::operator<<(poVar5,(string *)&local_1c0);
    std::operator<<(poVar5,")\n");
    std::__cxx11::string::~string((string *)&local_1c0);
    poVar5 = std::operator<<((ostream *)local_190,'\n');
    poVar5 = std::operator<<(poVar5,(string *)&this->detail);
    std::operator<<(poVar5,'\n');
    poVar5 = std::operator<<((ostream *)local_190,"  ");
    pvVar6 = std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>::
             operator[](&this->call_stack,0);
    psVar7 = fname<chaiscript::AST_Node_Trace>(pvVar6);
    poVar5 = std::operator<<(poVar5,(string *)psVar7);
    poVar5 = std::operator<<(poVar5," (");
    pvVar6 = std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>::
             operator[](&this->call_stack,0);
    startpos<chaiscript::AST_Node_Trace>(&local_1e0,pvVar6);
    poVar5 = std::operator<<(poVar5,(string *)&local_1e0);
    poVar5 = std::operator<<(poVar5,") \'");
    pvVar6 = std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>::
             operator[](&this->call_stack,0);
    pretty<chaiscript::AST_Node_Trace>((string *)&j,pvVar6);
    poVar5 = std::operator<<(poVar5,(string *)&j);
    std::operator<<(poVar5,"\'");
    std::__cxx11::string::~string((string *)&j);
    std::__cxx11::string::~string((string *)&local_1e0);
    for (local_208 = 1; uVar1 = local_208,
        sVar8 = std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
                ::size(&this->call_stack), uVar1 < sVar8; local_208 = local_208 + 1) {
      pvVar6 = std::vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
               ::operator[](&this->call_stack,local_208);
      AVar3 = id<chaiscript::AST_Node_Trace>(pvVar6);
      if (AVar3 != Block) {
        pvVar6 = std::
                 vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>::
                 operator[](&this->call_stack,local_208);
        AVar3 = id<chaiscript::AST_Node_Trace>(pvVar6);
        if (AVar3 != File) {
          std::operator<<((ostream *)local_190,'\n');
          poVar5 = std::operator<<((ostream *)local_190,"  from ");
          pvVar6 = std::
                   vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>::
                   operator[](&this->call_stack,local_208);
          psVar7 = fname<chaiscript::AST_Node_Trace>(pvVar6);
          poVar5 = std::operator<<(poVar5,(string *)psVar7);
          poVar5 = std::operator<<(poVar5," (");
          pvVar6 = std::
                   vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>::
                   operator[](&this->call_stack,local_208);
          startpos<chaiscript::AST_Node_Trace>(&local_228,pvVar6);
          poVar5 = std::operator<<(poVar5,(string *)&local_228);
          poVar5 = std::operator<<(poVar5,") \'");
          pvVar6 = std::
                   vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>::
                   operator[](&this->call_stack,local_208);
          pretty<chaiscript::AST_Node_Trace>(&local_248,pvVar6);
          poVar5 = std::operator<<(poVar5,(string *)&local_248);
          std::operator<<(poVar5,"\'");
          std::__cxx11::string::~string((string *)&local_248);
          std::__cxx11::string::~string((string *)&local_228);
        }
      }
    }
  }
  std::operator<<((ostream *)local_190,'\n');
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string pretty_print() const {
        std::ostringstream ss;

        ss << what();
        if (!call_stack.empty()) {
          ss << "during evaluation at (" << fname(call_stack[0]) << " " << startpos(call_stack[0]) << ")\n";
          ss << '\n'
             << detail << '\n';
          ss << "  " << fname(call_stack[0]) << " (" << startpos(call_stack[0]) << ") '" << pretty(call_stack[0]) << "'";
          for (size_t j = 1; j < call_stack.size(); ++j) {
            if (id(call_stack[j]) != chaiscript::AST_Node_Type::Block && id(call_stack[j]) != chaiscript::AST_Node_Type::File) {
              ss << '\n';
              ss << "  from " << fname(call_stack[j]) << " (" << startpos(call_stack[j]) << ") '" << pretty(call_stack[j]) << "'";
            }
          }
        }
        ss << '\n';
        return ss.str();
      }